

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O2

void __thiscall
embree::fast_allocator_regression_test::fast_allocator_regression_test
          (fast_allocator_regression_test *this)

{
  RegressionTest *in_stack_ffffffffffffffb8;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"fast_allocator_regression_test",&local_39);
  RegressionTest::RegressionTest(&this->super_RegressionTest,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR_run_021d4a50;
  BarrierSys::BarrierSys(&this->barrier,0);
  (this->numFailed).super___atomic_base<unsigned_long>._M_i = 0;
  (this->alloc)._M_t.
  super___uniq_ptr_impl<embree::FastAllocator,_std::default_delete<embree::FastAllocator>_>._M_t.
  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>.
  super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl = (FastAllocator *)0x0;
  registerRegressionTest(in_stack_ffffffffffffffb8);
  return;
}

Assistant:

fast_allocator_regression_test() 
      : RegressionTest("fast_allocator_regression_test"), numFailed(0)
    {
      registerRegressionTest(this);
    }